

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_fan(envy_bios *bios)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = (bios->power).fan.offset;
  iVar2 = -0x16;
  if (uVar5 != 0) {
    bios_u8(bios,uVar5,&(bios->power).fan.version);
    if ((bios->power).fan.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).fan.offset + 1,&(bios->power).fan.hlen);
      iVar3 = bios_u8(bios,(bios->power).fan.offset + 2,&(bios->power).fan.rlen);
      iVar4 = bios_u8(bios,(bios->power).fan.offset + 3,&(bios->power).fan.entriesnum);
      (bios->power).fan.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      uVar1 = (bios->power).fan.offset;
      uVar5 = (uint)(bios->power).fan.hlen;
      bios_u8(bios,uVar1 + uVar5,&(bios->power).fan.type);
      bios_u8(bios,uVar1 + uVar5 + 2,&(bios->power).fan.duty_min);
      bios_u8(bios,uVar1 + uVar5 + 3,&(bios->power).fan.duty_max);
      bios_u32(bios,uVar1 + uVar5 + 0xb,&(bios->power).fan.divisor);
      *(undefined1 *)((long)&(bios->power).fan.divisor + 3) = 0;
      bios_u16(bios,uVar1 + uVar5 + 0xe,&(bios->power).fan.unk0e);
      bios_u16(bios,uVar1 + uVar5 + 0x10,&(bios->power).fan.unk10);
      bios_u16(bios,uVar1 + uVar5 + 0x14,&(bios->power).fan.unboost_unboost_ms);
      bios_u8(bios,uVar1 + uVar5 + 0x17,&(bios->power).fan.duty_boosted);
      iVar2 = 0;
    }
    else {
      fprintf(_stderr,"Unknown FAN table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_fan(struct envy_bios *bios) {
	struct envy_bios_power_fan *fan = &bios->power.fan;
	uint32_t data;
	int err = 0;

	if (!fan->offset)
		return -EINVAL;

	bios_u8(bios, fan->offset + 0x0, &fan->version);
	switch(fan->version) {
	case 0x10:
		err |= bios_u8(bios, fan->offset + 0x1, &fan->hlen);
		err |= bios_u8(bios, fan->offset + 0x2, &fan->rlen);
		err |= bios_u8(bios, fan->offset + 0x3, &fan->entriesnum);

		fan->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN table version 0x%x\n", fan->version);
		return -EINVAL;
	};

	/* go to the first entry */
	data = fan->offset + fan->hlen;

	bios_u8(bios, data + 0x00, &fan->type);
	bios_u8(bios, data + 0x02, &fan->duty_min);
	bios_u8(bios, data + 0x03, &fan->duty_max);
	/* 0x10 == constant to 9? */
	bios_u32(bios, data + 0x0b, &fan->divisor); fan->divisor &= 0xffffff;
	bios_u16(bios, data + 0x0e, &fan->unk0e); /* looks like the fan bump delay */
	bios_u16(bios, data + 0x10, &fan->unk10); /* looks like the fan slow down delay */
	bios_u16(bios, data + 0x14, &fan->unboost_unboost_ms);
	bios_u8(bios, data + 0x17, &fan->duty_boosted); /* threshold = 96 °C */

	/* temp fan bump min = 45°C */
	/* temp fan max = 95°C */

	return 0;
}